

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O2

void __thiscall aeron::DriverProxy::sendClientKeepalive(DriverProxy *this)

{
  anon_class_8_1_8991fb9c local_8;
  
  local_8.this = this;
  writeCommandToDriver<aeron::DriverProxy::sendClientKeepalive()::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (this,&local_8);
  return;
}

Assistant:

void sendClientKeepalive()
    {
        writeCommandToDriver([&](AtomicBuffer& buffer, util::index_t& length)
        {
            CorrelatedMessageFlyweight correlatedMessage(buffer, 0);

            correlatedMessage.clientId(m_clientId);
            correlatedMessage.correlationId(0);

            length = CORRELATED_MESSAGE_LENGTH;

            return ControlProtocolEvents::CLIENT_KEEPALIVE;
        });
    }